

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

bool phmap::priv::operator==
               (raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                *a,raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                   *b)

{
  ctrl_t *pcVar1;
  size_t sVar2;
  bool bVar3;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *__range3;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *this;
  const_iterator __begin0;
  iterator local_30;
  
  if (a->size_ != b->size_) {
    return false;
  }
  this = a;
  if (b->capacity_ < a->capacity_) {
    this = b;
    b = a;
  }
  local_30 = raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
             ::begin(this);
  pcVar1 = this->ctrl_;
  sVar2 = this->capacity_;
  while( true ) {
    if (local_30.ctrl_ == pcVar1 + sVar2) {
      return true;
    }
    bVar3 = raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
            ::has_element(b,(value_type *)local_30.field_1.slot_);
    if (!bVar3) break;
    raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
    ::iterator::operator++(&local_30);
  }
  return false;
}

Assistant:

size_t size() const
			{
				return size_;
			}